

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O3

void __thiscall
deqp::gls::UniformBlockCase::UniformBlockCase
          (UniformBlockCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,
          char *description,GLSLVersion glslVersion,BufferMode bufferMode)

{
  bool bVar1;
  InternalError *this_00;
  int iVar2;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformBlockCase_0217b7e0;
  this->m_renderCtx = renderCtx;
  this->m_glslVersion = glslVersion;
  this->m_bufferMode = bufferMode;
  (this->m_interface).m_structs.
  super__Vector_base<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_interface).m_structs.
  super__Vector_base<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_interface).m_structs.
  super__Vector_base<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_interface).m_uniformBlocks.
  super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_interface).m_uniformBlocks.
  super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_interface).m_uniformBlocks.
  super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = glu::glslVersionIsES(glslVersion);
  iVar2 = 7;
  if (bVar1) {
    iVar2 = 1;
  }
  if (iVar2 <= (int)glslVersion) {
    return;
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this_00,(char *)0x0,"isSupportedGLSLVersion(glslVersion)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
             ,0x56a);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

UniformBlockCase::UniformBlockCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* description, glu::GLSLVersion glslVersion, BufferMode bufferMode)
	: TestCase		(testCtx, name, description)
	, m_renderCtx	(renderCtx)
	, m_glslVersion	(glslVersion)
	, m_bufferMode	(bufferMode)
{
	TCU_CHECK_INTERNAL(isSupportedGLSLVersion(glslVersion));
}